

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O2

void rfc5444_writer_cleanup(rfc5444_writer *writer)

{
  rfc5444_writer_pkthandler *prVar1;
  list_entity *plVar2;
  rfc5444_writer_postprocessor *prVar3;
  rfc5444_writer_message *prVar4;
  rfc5444_writer_pkthandler *pkt;
  rfc5444_writer_postprocessor *processor;
  list_entity *plVar5;
  rfc5444_writer_message *msg;
  
  if (writer == (rfc5444_writer *)0x0) {
    __assert_fail("writer",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                  ,0x83,"void rfc5444_writer_cleanup(struct rfc5444_writer *)");
  }
  if (writer->_state == RFC5444_WRITER_NONE) {
    pkt = (rfc5444_writer_pkthandler *)(writer->_pkthandlers).next;
    while ((pkt->_pkthandle_node).prev != (writer->_pkthandlers).prev) {
      prVar1 = (rfc5444_writer_pkthandler *)(pkt->_pkthandle_node).next;
      rfc5444_writer_unregister_pkthandler(writer,pkt);
      pkt = prVar1;
    }
    plVar5 = (writer->_targets).next;
    while (plVar5->prev != (writer->_targets).prev) {
      plVar2 = plVar5->next;
      rfc5444_writer_unregister_target(writer,(rfc5444_writer_target *)(plVar5 + -3));
      plVar5 = plVar2;
    }
    plVar5 = (writer->_addr_tlvtype_head).next;
    while (plVar5->prev != (writer->_addr_tlvtype_head).prev) {
      plVar2 = plVar5->next;
      rfc5444_writer_unregister_addrtlvtype(writer,(rfc5444_writer_tlvtype *)&plVar5[-1].prev);
      plVar5 = plVar2;
    }
    processor = (rfc5444_writer_postprocessor *)(writer->_processors).list_head.next;
    while ((processor->_node).list.prev != (writer->_processors).list_head.prev) {
      prVar3 = (rfc5444_writer_postprocessor *)(processor->_node).list.next;
      rfc5444_writer_unregister_postprocessor(writer,processor);
      processor = prVar3;
    }
    msg = (rfc5444_writer_message *)(writer->_msgcreators).list_head.next;
    while ((msg->_msgcreator_node).list.prev != (writer->_msgcreators).list_head.prev) {
      prVar4 = (rfc5444_writer_message *)(msg->_msgcreator_node).list.next;
      msg->_registered = true;
      plVar5 = (msg->_provider_tree).list_head.next;
      while (plVar5->prev != (msg->_provider_tree).list_head.prev) {
        plVar2 = plVar5->next;
        rfc5444_writer_unregister_content_provider
                  (writer,(rfc5444_writer_content_provider *)(plVar5 + -2),
                   (rfc5444_writer_tlvtype *)0x0,0);
        plVar5 = plVar2;
      }
      plVar5 = (msg->_msgspecific_tlvtype_head).next;
      while (plVar5->prev != (msg->_msgspecific_tlvtype_head).prev) {
        plVar2 = plVar5->next;
        rfc5444_writer_unregister_addrtlvtype(writer,(rfc5444_writer_tlvtype *)&plVar5[-1].prev);
        plVar5 = plVar2;
      }
      rfc5444_writer_unregister_message(writer,msg);
      msg = prVar4;
    }
    return;
  }
  __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                ,0x85,"void rfc5444_writer_cleanup(struct rfc5444_writer *)");
}

Assistant:

void
rfc5444_writer_cleanup(struct rfc5444_writer *writer) {
  struct rfc5444_writer_message *msg, *safe_msg;
  struct rfc5444_writer_pkthandler *pkt, *safe_pkt;
  struct rfc5444_writer_content_provider *provider, *safe_prv;
  struct rfc5444_writer_tlvtype *tlvtype, *safe_tt;
  struct rfc5444_writer_target *interf, *safe_interf;
  struct rfc5444_writer_postprocessor *processor, *safe_proc;

  assert(writer);
#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif

  /* remove all packet handlers */
  list_for_each_element_safe(&writer->_pkthandlers, pkt, _pkthandle_node, safe_pkt) {
    rfc5444_writer_unregister_pkthandler(writer, pkt);
  }

  /* remove all _targets */
  list_for_each_element_safe(&writer->_targets, interf, _target_node, safe_interf) {
    rfc5444_writer_unregister_target(writer, interf);
  }

  /* remove all generic address tlvtypes */
  list_for_each_element_safe(&writer->_addr_tlvtype_head, tlvtype, _tlvtype_node, safe_tt) {
    rfc5444_writer_unregister_addrtlvtype(writer, tlvtype);
  }

  /* remove all packet postprocessors */
  avl_for_each_element_safe(&writer->_processors, processor, _node, safe_proc) {
    rfc5444_writer_unregister_postprocessor(writer, processor);
  }

  /* remove all message creators */
  avl_for_each_element_safe(&writer->_msgcreators, msg, _msgcreator_node, safe_msg) {
    /* prevent message from being freed in the middle of the processing */
    msg->_registered = true;

    /* remove all message content providers */
    avl_for_each_element_safe(&msg->_provider_tree, provider, _provider_node, safe_prv) {
      rfc5444_writer_unregister_content_provider(writer, provider, NULL, 0);
    }

    /* remove all registered address tlvs */
    list_for_each_element_safe(&msg->_msgspecific_tlvtype_head, tlvtype, _tlvtype_node, safe_tt) {
      rfc5444_writer_unregister_addrtlvtype(writer, tlvtype);
    }

    /* remove message and addresses */
    rfc5444_writer_unregister_message(writer, msg);
  }
}